

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O0

void __thiscall
TApp_IniOutputVector_Test::~TApp_IniOutputVector_Test(TApp_IniOutputVector_Test *this)

{
  TApp_IniOutputVector_Test *this_local;
  
  ~TApp_IniOutputVector_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, IniOutputVector) {

    std::vector<int> v;
    app.add_option("--vector", v);

    args = {"--vector", "1", "2", "3"};

    run();

    std::string str = app.config_to_str();
    EXPECT_EQ("vector=1 2 3\n", str);
}